

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadTest::DeleteBuffer::exec(DeleteBuffer *this,Thread *t)

{
  deUint32 err;
  deBool dVar1;
  Buffer *pBVar2;
  MessageBuilder *pMVar3;
  MessageBuilder local_358;
  MessageBuilder local_1b8;
  GLuint local_24;
  Thread *pTStack_20;
  GLuint buffer;
  EGLThread *thread;
  Thread *t_local;
  DeleteBuffer *this_local;
  
  thread = (EGLThread *)t;
  t_local = (Thread *)this;
  pTStack_20 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0)
  ;
  if (pTStack_20 == (Thread *)0x0) {
    __cxa_bad_cast();
  }
  pBVar2 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::operator->(&this->m_buffer);
  local_24 = pBVar2->buffer;
  tcu::ThreadUtil::Thread::newMessage(&local_1b8,pTStack_20);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1b8,(char (*) [31])"Begin -- glDeleteBuffers(1, { ");
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,&local_24);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(char (*) [4])0x2b3cf08);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1b8);
  do {
    (**(code **)(*(long *)&pTStack_20[1].super_Thread.m_attribs + 0x438))(1,&local_24);
    err = (**(code **)(*(long *)&pTStack_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(err,"deleteBuffers(1, &buffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x4c8);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_358,pTStack_20);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_358,(char (*) [25])"End -- glDeleteBuffers()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_358);
  pBVar2 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::operator->(&this->m_buffer);
  pBVar2->buffer = 0;
  return;
}

Assistant:

void DeleteBuffer::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);
	GLuint buffer = m_buffer->buffer;

	thread.newMessage() << "Begin -- glDeleteBuffers(1, { " << buffer << " })" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, deleteBuffers(1, &buffer));
	thread.newMessage() << "End -- glDeleteBuffers()" << tcu::ThreadUtil::Message::End;

	m_buffer->buffer = 0;
}